

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkResVtolerance(ARKodeMem ark_mem,N_Vector rabstol)

{
  int iVar1;
  int error_code;
  char *pcVar2;
  realtype rVar3;
  
  if (ark_mem == (ARKodeMem)0x0) {
    pcVar2 = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    ark_mem = (ARKodeMem)0x0;
    error_code = -0x15;
  }
  else {
    if (ark_mem->MallocDone == 0) {
      pcVar2 = "Attempt to call before ARKodeInit.";
    }
    else {
      if (rabstol != (N_Vector)0x0) {
        if (rabstol->ops->nvmin == (_func_realtype_N_Vector *)0x0) {
          pcVar2 = "Missing N_VMin routine from N_Vector";
        }
        else {
          rVar3 = N_VMin(rabstol);
          if (0.0 <= rVar3) {
            ark_mem->Ratolmin0 = -(uint)(rVar3 == 0.0) & 1;
            if (ark_mem->rwt_is_ewt != 0) {
              ark_mem->rwt = (N_Vector)0x0;
              iVar1 = arkAllocVec(ark_mem,ark_mem->ewt,&ark_mem->rwt);
              if (iVar1 == 0) {
                pcVar2 = "arkResVtolerances";
                goto LAB_004167fd;
              }
              ark_mem->rwt_is_ewt = 0;
            }
            if (ark_mem->VRabstolMallocDone == 0) {
              iVar1 = arkAllocVec(ark_mem,ark_mem->rwt,&ark_mem->VRabstol);
              if (iVar1 == 0) {
                pcVar2 = "arkResStolerances";
LAB_004167fd:
                arkProcessError(ark_mem,-0x14,"ARKode",pcVar2,"Allocation of arkode_mem failed.");
                return -0x16;
              }
              ark_mem->VRabstolMallocDone = 1;
            }
            N_VScale(1.0,rabstol,ark_mem->VRabstol);
            ark_mem->ritol = 1;
            ark_mem->user_efun = 0;
            ark_mem->rfun = arkRwtSet;
            ark_mem->r_data = ark_mem;
            return 0;
          }
          pcVar2 = "rabstol has negative component(s) (illegal).";
        }
        iVar1 = -0x16;
        error_code = -0x16;
        goto LAB_00416727;
      }
      pcVar2 = "rabstol = NULL illegal.";
    }
    iVar1 = -0x17;
    error_code = -0x17;
  }
LAB_00416727:
  arkProcessError(ark_mem,error_code,"ARKode","arkResVtolerance",pcVar2);
  return iVar1;
}

Assistant:

int arkResVtolerance(ARKodeMem ark_mem, N_Vector rabstol)
{
  /* local variables */
  realtype rabstolmin;

  /* Check inputs */
  if (ark_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkResVtolerance", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkResVtolerance", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }
  if (rabstol == NULL) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkResVtolerance", MSG_ARK_NULL_RABSTOL);
    return(ARK_NO_MALLOC);
  }
  if (rabstol->ops->nvmin == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkResVtolerance",
                   "Missing N_VMin routine from N_Vector");
    return(ARK_ILL_INPUT);
  }
  rabstolmin = N_VMin(rabstol);
  if (rabstolmin < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkResVtolerance", MSG_ARK_BAD_RABSTOL);
    return(ARK_ILL_INPUT);
  }

  /* Set flag indicating whether min(abstol) == 0 */
  ark_mem->Ratolmin0 = (rabstolmin == ZERO);

  /* Allocate space for rwt if necessary */
  if (ark_mem->rwt_is_ewt) {
    ark_mem->rwt = NULL;
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->rwt))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                      "arkResVtolerances", MSG_ARK_ARKMEM_FAIL);
      return(ARK_ILL_INPUT);
    }
    ark_mem->rwt_is_ewt = SUNFALSE;
  }

  /* Copy tolerances into memory */
  if ( !(ark_mem->VRabstolMallocDone) ) {
    if (!arkAllocVec(ark_mem, ark_mem->rwt, &(ark_mem->VRabstol))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                      "arkResStolerances", MSG_ARK_ARKMEM_FAIL);
      return(ARK_ILL_INPUT);
    }
    ark_mem->VRabstolMallocDone = SUNTRUE;
  }
  N_VScale(ONE, rabstol, ark_mem->VRabstol);
  ark_mem->ritol = ARK_SV;


  /* enforce use of arkRwtSet */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->rfun      = arkRwtSet;
  ark_mem->r_data    = ark_mem;

  return(ARK_SUCCESS);
}